

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
NodeSet::topological_order(vector<int,_std::allocator<int>_> *__return_storage_ptr__,NodeSet *this)

{
  pointer piVar1;
  _Rb_tree_node_base *p_Var2;
  int iVar3;
  _Rb_tree_header *p_Var4;
  allocator_type local_21;
  
  std::vector<int,_std::allocator<int>_>::vector
            (__return_storage_ptr__,(this->index)._M_t._M_impl.super__Rb_tree_header._M_node_count,
             &local_21);
  p_Var2 = (this->index)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = &(this->index)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var4) {
    piVar1 = (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    do {
      piVar1[*(int *)&p_Var2[1]._M_right] = iVar3;
      iVar3 = iVar3 + 1;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> NodeSet::topological_order() const {
	std::vector<int> ord(index.size());
	int pos = 0;
	for (const auto &kvpair : index) {
		ord[kvpair.second] = pos++;
	}
	return ord;
}